

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O3

uint32_t __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldOffset
          (ReflectionSchema *this,FieldDescriptor *field)

{
  uint uVar1;
  long lVar2;
  uint32_t uVar3;
  uint uVar4;
  FieldDescriptor *local_20;
  _func_void_FieldDescriptor_ptr *local_18;
  
  lVar2 = *(long *)(field + 0x28);
  if ((lVar2 != 0 && ((byte)field[1] & 0x10) != 0) &&
     ((*(int *)(lVar2 + 4) != 1 || ((*(byte *)(*(long *)(lVar2 + 0x20) + 1) & 2) == 0)))) {
    uVar1 = this->offsets_
            [(long)((int)((ulong)(lVar2 - *(long *)(*(long *)(lVar2 + 0x10) + 0x30)) >> 3) *
                   -0x33333333) + (long)*(int *)(*(long *)(field + 0x20) + 4)];
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_18 = FieldDescriptor::TypeOnceInit;
      local_20 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),&local_18,&local_20);
    }
    uVar4 = 0x7fffffff;
    if ((byte)((char)field[2] - 9U) < 4) {
      uVar4 = *(uint *)(&DAT_00438ca0 + (ulong)(byte)((char)field[2] - 9U) * 4);
    }
    return uVar4 & uVar1;
  }
  uVar3 = GetFieldOffsetNonOneof(this,field);
  return uVar3;
}

Assistant:

uint32_t GetFieldOffset(const FieldDescriptor* field) const {
    if (InRealOneof(field)) {
      size_t offset =
          static_cast<size_t>(field->containing_type()->field_count() +
                              field->containing_oneof()->index());
      return OffsetValue(offsets_[offset], field->type());
    } else {
      return GetFieldOffsetNonOneof(field);
    }
  }